

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateIfThenResultIntoCondition<std::array<int,3ul>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,array<int,_3UL> args,Context ctx)

{
  bool bVar1;
  Context *this_00;
  double dVar2;
  double unaff_retaddr;
  double in_stack_00000008;
  int in_stack_00000014;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_00000018;
  Context in_stack_00000024;
  Context ctx_cond;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_ffffffffffffffb0;
  Context local_2c [3];
  Context local_20 [8];
  
  Context::Context(local_2c,CTX_MIX);
  bVar1 = Context::IsPositive(local_20);
  if ((bVar1) || (bVar1 = Context::IsNegative(local_20), bVar1)) {
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    this_00 = (Context *)
              FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::lb(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::array<int,_3UL>::operator[]
              ((array<int,_3UL> *)in_stack_ffffffffffffffb0,
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    dVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            ::ub(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    if ((double)this_00 < dVar2) {
      std::array<int,_3UL>::operator[]
                ((array<int,_3UL> *)in_stack_ffffffffffffffb0,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      in_stack_ffffffffffffffb0 =
           (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
            *)FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::lb(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      std::array<int,_3UL>::operator[]
                ((array<int,_3UL> *)in_stack_ffffffffffffffb0,
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      dVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::ub(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
      if (dVar2 <= (double)in_stack_ffffffffffffffb0) {
        local_2c[0] = Context::operator-(this_00);
      }
    }
    else {
      local_2c[0] = Context::operator+(this_00);
    }
  }
  std::array<int,_3UL>::operator[]
            ((array<int,_3UL> *)in_stack_ffffffffffffffb0,
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,in_stack_00000024);
  return;
}

Assistant:

void PropagateIfThenResultIntoCondition(Array3 args, Context ctx) {
    Context ctx_cond = Context::CTX_MIX;
    if (ctx.IsPositive() || ctx.IsNegative()) {
      if (MPCD( lb(args[1]) ) >= MPCD( ub(args[2]) ))
        ctx_cond = +ctx;
      else if (MPCD( lb(args[2]) ) >= MPCD( ub(args[1]) ))
        ctx_cond = -ctx;
    }
    MPD( PropagateResultOfInitExpr(args[0], 0.0, 1.0, ctx_cond) );
  }